

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span.h
# Opt level: O2

void __thiscall
absl::lts_20240722::Span<const_char>::remove_prefix(Span<const_char> *this,size_type n)

{
  ulong uVar1;
  anon_class_1_0_00000001 local_11;
  
  uVar1 = this->len_;
  if (uVar1 < n) {
    remove_prefix::anon_class_1_0_00000001::operator()(&local_11);
    uVar1 = this->len_;
  }
  this->ptr_ = this->ptr_ + n;
  this->len_ = uVar1 - n;
  return;
}

Assistant:

void remove_prefix(size_type n) noexcept {
    ABSL_HARDENING_ASSERT(size() >= n);
    ptr_ += n;
    len_ -= n;
  }